

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::UpdateTransformState(Element *this)

{
  undefined1 *puVar1;
  ElementMeta *pEVar2;
  Vector2f VVar3;
  RareValues RVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  Matrix4f *pMVar16;
  TransformState *pTVar17;
  TransformPrimitive *p;
  pointer puVar18;
  ulong uVar19;
  bool bVar20;
  int i;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Matrix4f perspective;
  TransformPtr transform_ptr;
  Matrix4f matrix;
  ThisType result_2;
  ThisType result_1;
  float local_1b8;
  float fStack_1b4;
  Matrix4f local_1a8;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  MatrixAType local_148;
  Element *local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  Matrix4f local_f8;
  MatrixBType local_b8;
  MatrixAType local_78;
  
  if ((this->field_0x17 & 0x60) != 0) {
    pEVar2 = this->meta;
    UpdateAbsoluteOffsetAndRenderBoxData(this);
    local_158._8_8_ = 0;
    local_158._0_4_ = (this->absolute_offset).x;
    local_158._4_4_ = (this->absolute_offset).y;
    VVar3 = Box::GetSize(&this->main_box,Border);
    bVar21 = false;
    local_1b8 = VVar3.x;
    fStack_1b4 = VVar3.y;
    if ((this->field_0x17 & 0x40) != 0) {
      pTVar17 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar17 != (TransformState *)0x0) {
        pMVar16 = TransformState::GetLocalPerspective(pTVar17);
        bVar21 = pMVar16 != (Matrix4f *)0x0;
      }
      fVar23 = (pEVar2->computed_values).rare.perspective;
      if (fVar23 <= 0.0) {
        pTVar17 = (this->transform_state)._M_t.
                  super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                  .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
        bVar13 = false;
        if (pTVar17 != (TransformState *)0x0) {
          TransformState::SetLocalPerspective(pTVar17,(Matrix4f *)0x0);
          bVar13 = false;
        }
      }
      else {
        RVar4 = (pEVar2->computed_values).rare;
        fVar22 = (pEVar2->computed_values).rare.perspective_origin_x;
        if (((undefined1  [80])RVar4 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
          fVar22 = fVar22 * 0.01 * local_1b8;
        }
        fVar24 = (pEVar2->computed_values).rare.perspective_origin_y;
        if (((undefined1  [80])RVar4 & (undefined1  [80])0x20) != (undefined1  [80])0x0) {
          fVar24 = fVar24 * 0.01 * fStack_1b4;
        }
        local_1a8.vectors[0].x = 1.0;
        local_1a8.vectors[0].y = 0.0;
        local_1a8.vectors[1].x = 0.0;
        local_1a8.vectors[1].y = 1.0;
        local_1a8.vectors[3].x = 0.0;
        local_1a8.vectors[3].y = 0.0;
        local_1a8.vectors[2].y = -((float)local_158._4_4_ + fVar24) / fVar23;
        local_1a8.vectors[2].x = -(fVar22 + (float)local_158._0_4_) / fVar23;
        local_1a8.vectors[0].z = 0.0;
        local_1a8.vectors[0].w = 0.0;
        local_1a8.vectors[1].z = 0.0;
        local_1a8.vectors[1].w = 0.0;
        local_1a8.vectors[3].z = 0.0;
        local_1a8.vectors[3].w = 1.0;
        local_1a8.vectors[2].w = -1.0 / fVar23;
        local_1a8.vectors[2].z = 1.0;
        if ((this->transform_state)._M_t.
            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
            _M_t.
            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl ==
            (TransformState *)0x0) {
          pTVar17 = (TransformState *)operator_new(0xc4);
          memset(pTVar17,0,0xc4);
          (this->transform_state)._M_t.
          super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t
          .super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
          super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = pTVar17;
        }
        bVar13 = TransformState::SetLocalPerspective
                           ((this->transform_state)._M_t.
                            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl,
                            &local_1a8);
      }
      bVar21 = (bool)(bVar21 != 0.0 < fVar23 | bVar13);
      this->field_0x17 = this->field_0x17 & 0xbf;
    }
    if ((this->field_0x17 & 0x20) != 0) {
      pTVar17 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (pTVar17 == (TransformState *)0x0) {
        bVar13 = false;
      }
      else {
        pMVar16 = TransformState::GetTransform(pTVar17);
        bVar13 = pMVar16 != (Matrix4f *)0x0;
      }
      if (Matrix4<float,Rml::ColumnMajorStorage<float>>::Identity()::identity == '\0') {
        UpdateTransformState();
      }
      local_148.vectors[3].x =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].x;
      local_148.vectors[3].y =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].y;
      local_148.vectors[3].z =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].z;
      local_148.vectors[3].w =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].w;
      local_148.vectors[2].x =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].x;
      local_148.vectors[2].y =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].y;
      local_148.vectors[2].z =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].z;
      local_148.vectors[2].w =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].w;
      local_148.vectors[1].x =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].x;
      local_148.vectors[1].y =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].y;
      local_148.vectors[1].z =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].z;
      local_148.vectors[1].w =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].w;
      local_148.vectors[0].x =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].x;
      local_148.vectors[0].y =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].y;
      local_148.vectors[0].z =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].z;
      local_148.vectors[0].w =
           Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].w;
      Style::ComputedValues::transform((ComputedValues *)&local_108);
      if (local_108 == (Element *)0x0) {
        bVar20 = false;
      }
      else {
        local_168._0_8_ = pEVar2;
        iVar15 = Transform::GetNumPrimitives((Transform *)local_108);
        i = 0;
        if (0 < iVar15) {
          uVar5 = local_148.vectors[0]._0_8_;
          uVar6 = local_148.vectors[0]._8_8_;
          uVar7 = local_148.vectors[1]._0_8_;
          uVar8 = local_148.vectors[1]._8_8_;
          uVar9 = local_148.vectors[2]._0_8_;
          uVar10 = local_148.vectors[2]._8_8_;
          uVar11 = local_148.vectors[3]._0_8_;
          uVar12 = local_148.vectors[3]._8_8_;
          do {
            local_148.vectors[3]._8_8_ = uVar12;
            local_148.vectors[3]._0_8_ = uVar11;
            local_148.vectors[2]._8_8_ = uVar10;
            local_148.vectors[2]._0_8_ = uVar9;
            local_148.vectors[1]._8_8_ = uVar8;
            local_148.vectors[1]._0_8_ = uVar7;
            local_148.vectors[0]._8_8_ = uVar6;
            local_148.vectors[0]._0_8_ = uVar5;
            p = Transform::GetPrimitive((Transform *)local_108,i);
            TransformUtilities::ResolveTransform(&local_f8,p,this);
            Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
            MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>
            ::Multiply(&local_148,&local_f8);
            uVar5._0_4_ = local_1a8.vectors[0].x;
            uVar5._4_4_ = local_1a8.vectors[0].y;
            uVar6._0_4_ = local_1a8.vectors[0].z;
            uVar6._4_4_ = local_1a8.vectors[0].w;
            uVar7._0_4_ = local_1a8.vectors[1].x;
            uVar7._4_4_ = local_1a8.vectors[1].y;
            uVar8._0_4_ = local_1a8.vectors[1].z;
            uVar8._4_4_ = local_1a8.vectors[1].w;
            uVar9._0_4_ = local_1a8.vectors[2].x;
            uVar9._4_4_ = local_1a8.vectors[2].y;
            uVar10._0_4_ = local_1a8.vectors[2].z;
            uVar10._4_4_ = local_1a8.vectors[2].w;
            uVar11._0_4_ = local_1a8.vectors[3].x;
            uVar11._4_4_ = local_1a8.vectors[3].y;
            uVar12._0_4_ = local_1a8.vectors[3].z;
            uVar12._4_4_ = local_1a8.vectors[3].w;
            local_148.vectors[3].x = local_1a8.vectors[3].x;
            local_148.vectors[3].y = local_1a8.vectors[3].y;
            local_148.vectors[3].z = local_1a8.vectors[3].z;
            local_148.vectors[3].w = local_1a8.vectors[3].w;
            local_148.vectors[2].x = local_1a8.vectors[2].x;
            local_148.vectors[2].y = local_1a8.vectors[2].y;
            local_148.vectors[2].z = local_1a8.vectors[2].z;
            local_148.vectors[2].w = local_1a8.vectors[2].w;
            local_148.vectors[1].x = local_1a8.vectors[1].x;
            local_148.vectors[1].y = local_1a8.vectors[1].y;
            local_148.vectors[1].z = local_1a8.vectors[1].z;
            local_148.vectors[1].w = local_1a8.vectors[1].w;
            local_148.vectors[0].x = local_1a8.vectors[0].x;
            local_148.vectors[0].y = local_1a8.vectors[0].y;
            local_148.vectors[0].z = local_1a8.vectors[0].z;
            local_148.vectors[0].w = local_1a8.vectors[0].w;
            i = i + 1;
          } while (iVar15 != i);
          i = 1;
        }
        bVar20 = SUB41(i,0);
        if (bVar20 != false) {
          local_78.vectors[3].x = *(float *)(local_168._0_8_ + 0x278);
          if ((*(uint *)(local_168._0_8_ + 0x250) & 0x40) != 0) {
            local_78.vectors[3].x = local_78.vectors[3].x * local_1b8 * 0.01;
          }
          local_78.vectors[3].x = local_78.vectors[3].x + (float)local_158._0_4_;
          fVar23 = *(float *)(local_168._0_8_ + 0x27c);
          if ((char)*(uint *)(local_168._0_8_ + 0x250) < '\0') {
            fVar23 = fStack_1b4 * fVar23 * 0.01;
          }
          fVar23 = (float)local_158._4_4_ + fVar23;
          local_78.vectors[0].x = 1.0;
          local_78.vectors[0].y = 0.0;
          local_78.vectors[1].x = 0.0;
          local_78.vectors[1].y = 1.0;
          local_78.vectors[2].x = 0.0;
          local_78.vectors[2].y = 0.0;
          local_78.vectors[3].y = fVar23;
          local_78.vectors[0].z = 0.0;
          local_78.vectors[0].w = 0.0;
          local_78.vectors[1]._8_8_ = 0;
          local_78.vectors[2].z = 1.0;
          local_78.vectors[2].w = 0.0;
          local_78.vectors[3].w = 1.0;
          local_78.vectors[3].z = *(float *)(local_168._0_8_ + 0x280);
          local_158 = ZEXT416((uint)*(float *)(local_168._0_8_ + 0x280));
          local_168 = ZEXT416((uint)local_78.vectors[3].x);
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
          MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
          Multiply(&local_78,&local_148);
          local_b8.vectors[0].x = 1.0;
          local_b8.vectors[0].y = 0.0;
          local_b8.vectors[1].x = 0.0;
          local_b8.vectors[1].y = 1.0;
          local_b8.vectors[2].x = 0.0;
          local_b8.vectors[2].y = 0.0;
          local_b8.vectors[3]._0_8_ = CONCAT44(fVar23,local_168._0_4_) ^ 0x8000000080000000;
          local_b8.vectors[0].z = 0.0;
          local_b8.vectors[0].w = 0.0;
          local_b8.vectors[1].z = 0.0;
          local_b8.vectors[1].w = 0.0;
          local_b8.vectors[2].z = 1.0;
          local_b8.vectors[2].w = 0.0;
          local_b8.vectors[3].w = 1.0;
          local_b8.vectors[3].z = (float)(local_158._0_4_ ^ 0x80000000);
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
          MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
          Multiply(&local_f8,&local_b8);
          local_148.vectors[3].x = local_1a8.vectors[3].x;
          local_148.vectors[3].y = local_1a8.vectors[3].y;
          local_148.vectors[3].z = local_1a8.vectors[3].z;
          local_148.vectors[3].w = local_1a8.vectors[3].w;
          local_148.vectors[2].x = local_1a8.vectors[2].x;
          local_148.vectors[2].y = local_1a8.vectors[2].y;
          local_148.vectors[2].z = local_1a8.vectors[2].z;
          local_148.vectors[2].w = local_1a8.vectors[2].w;
          local_148.vectors[1].x = local_1a8.vectors[1].x;
          local_148.vectors[1].y = local_1a8.vectors[1].y;
          local_148.vectors[1].z = local_1a8.vectors[1].z;
          local_148.vectors[1].w = local_1a8.vectors[1].w;
          local_148.vectors[0].x = local_1a8.vectors[0].x;
          local_148.vectors[0].y = local_1a8.vectors[0].y;
          local_148.vectors[0].z = local_1a8.vectors[0].z;
          local_148.vectors[0].w = local_1a8.vectors[0].w;
        }
      }
      if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
      }
      if ((this->parent != (Element *)0x0) &&
         (pTVar17 = (this->parent->transform_state)._M_t.
                    super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                    .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl,
         pTVar17 != (TransformState *)0x0)) {
        pMVar16 = TransformState::GetLocalPerspective(pTVar17);
        if (pMVar16 != (Matrix4f *)0x0) {
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
          MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
          Multiply(pMVar16,&local_148);
          local_148.vectors[3].x = local_1a8.vectors[3].x;
          local_148.vectors[3].y = local_1a8.vectors[3].y;
          local_148.vectors[3].z = local_1a8.vectors[3].z;
          local_148.vectors[3].w = local_1a8.vectors[3].w;
          local_148.vectors[2].x = local_1a8.vectors[2].x;
          local_148.vectors[2].y = local_1a8.vectors[2].y;
          local_148.vectors[2].z = local_1a8.vectors[2].z;
          local_148.vectors[2].w = local_1a8.vectors[2].w;
          local_148.vectors[1].x = local_1a8.vectors[1].x;
          local_148.vectors[1].y = local_1a8.vectors[1].y;
          local_148.vectors[1].z = local_1a8.vectors[1].z;
          local_148.vectors[1].w = local_1a8.vectors[1].w;
          local_148.vectors[0].x = local_1a8.vectors[0].x;
          local_148.vectors[0].y = local_1a8.vectors[0].y;
          local_148.vectors[0].z = local_1a8.vectors[0].z;
          local_148.vectors[0].w = local_1a8.vectors[0].w;
          bVar20 = true;
        }
        pMVar16 = TransformState::GetTransform(pTVar17);
        if (pMVar16 != (Matrix4f *)0x0) {
          Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
          MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
          Multiply(pMVar16,&local_148);
          local_148.vectors[3].x = local_1a8.vectors[3].x;
          local_148.vectors[3].y = local_1a8.vectors[3].y;
          local_148.vectors[3].z = local_1a8.vectors[3].z;
          local_148.vectors[3].w = local_1a8.vectors[3].w;
          local_148.vectors[2].x = local_1a8.vectors[2].x;
          local_148.vectors[2].y = local_1a8.vectors[2].y;
          local_148.vectors[2].z = local_1a8.vectors[2].z;
          local_148.vectors[2].w = local_1a8.vectors[2].w;
          local_148.vectors[1].x = local_1a8.vectors[1].x;
          local_148.vectors[1].y = local_1a8.vectors[1].y;
          local_148.vectors[1].z = local_1a8.vectors[1].z;
          local_148.vectors[1].w = local_1a8.vectors[1].w;
          local_148.vectors[0].x = local_1a8.vectors[0].x;
          local_148.vectors[0].y = local_1a8.vectors[0].y;
          local_148.vectors[0].z = local_1a8.vectors[0].z;
          local_148.vectors[0].w = local_1a8.vectors[0].w;
          bVar20 = true;
        }
      }
      pTVar17 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      if (bVar20 == false) {
        if (pTVar17 != (TransformState *)0x0) {
          TransformState::SetTransform(pTVar17,(Matrix4f *)0x0);
        }
      }
      else {
        if (pTVar17 == (TransformState *)0x0) {
          pTVar17 = (TransformState *)operator_new(0xc4);
          memset(pTVar17,0,0xc4);
          (this->transform_state)._M_t.
          super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t
          .super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
          super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = pTVar17;
        }
        bVar14 = TransformState::SetTransform
                           ((this->transform_state)._M_t.
                            super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                            .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl,
                            &local_148);
        bVar21 = (bool)(bVar21 | bVar14);
      }
      bVar21 = (bool)(bVar21 | bVar13 != bVar20);
    }
    if ((bVar21 != false) &&
       (puVar18 = (this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       (this->children).
       super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != puVar18)) {
      uVar19 = 0;
      do {
        puVar1 = &(puVar18[uVar19]._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
        *puVar1 = *puVar1 | 0x20;
        uVar19 = uVar19 + 1;
        puVar18 = (this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar19 < (ulong)((long)(this->children).
                                      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar18 >>
                               3));
    }
    pTVar17 = (this->transform_state)._M_t.
              super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
              .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
    if (((pTVar17 != (TransformState *)0x0) &&
        (pMVar16 = TransformState::GetTransform(pTVar17), pMVar16 == (Matrix4f *)0x0)) &&
       (pMVar16 = TransformState::GetLocalPerspective
                            ((this->transform_state)._M_t.
                             super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                             .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl),
       pMVar16 == (Matrix4f *)0x0)) {
      pTVar17 = (this->transform_state)._M_t.
                super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>
                .super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl;
      (this->transform_state)._M_t.
      super___uniq_ptr_impl<Rml::TransformState,_std::default_delete<Rml::TransformState>_>._M_t.
      super__Tuple_impl<0UL,_Rml::TransformState_*,_std::default_delete<Rml::TransformState>_>.
      super__Head_base<0UL,_Rml::TransformState_*,_false>._M_head_impl = (TransformState *)0x0;
      if (pTVar17 != (TransformState *)0x0) {
        operator_delete(pTVar17,0xc4);
      }
    }
  }
  return;
}

Assistant:

void Element::UpdateTransformState()
{
	if (!dirty_perspective && !dirty_transform)
		return;

	const ComputedValues& computed = meta->computed_values;

	const Vector2f pos = GetAbsoluteOffset(BoxArea::Border);
	const Vector2f size = GetBox().GetSize(BoxArea::Border);

	bool perspective_or_transform_changed = false;

	if (dirty_perspective)
	{
		// If perspective is set on this element, then it applies to our children. We just calculate it here,
		// and let the children's transform update merge it with their transform.
		bool had_perspective = (transform_state && transform_state->GetLocalPerspective());

		float distance = computed.perspective();
		Vector2f vanish = Vector2f(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f);
		bool have_perspective = false;

		if (distance > 0.0f)
		{
			have_perspective = true;

			// Compute the vanishing point from the perspective origin
			if (computed.perspective_origin_x().type == Style::PerspectiveOrigin::Percentage)
				vanish.x = pos.x + computed.perspective_origin_x().value * 0.01f * size.x;
			else
				vanish.x = pos.x + computed.perspective_origin_x().value;

			if (computed.perspective_origin_y().type == Style::PerspectiveOrigin::Percentage)
				vanish.y = pos.y + computed.perspective_origin_y().value * 0.01f * size.y;
			else
				vanish.y = pos.y + computed.perspective_origin_y().value;
		}

		if (have_perspective)
		{
			// Equivalent to: Translate(x,y,0) * Perspective(distance) * Translate(-x,-y,0)
			Matrix4f perspective = Matrix4f::FromRows( //
				{1, 0, -vanish.x / distance, 0},       //
				{0, 1, -vanish.y / distance, 0},       //
				{0, 0, 1, 0},                          //
				{0, 0, -1 / distance, 1}               //
			);

			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetLocalPerspective(&perspective);
		}
		else if (transform_state)
			transform_state->SetLocalPerspective(nullptr);

		perspective_or_transform_changed |= (have_perspective != had_perspective);

		dirty_perspective = false;
	}

	if (dirty_transform)
	{
		// We want to find the accumulated transform given all our ancestors. It is assumed here that the parent transform is already updated,
		// so that we only need to consider our local transform and combine it with our parent's transform and perspective matrices.
		bool had_transform = (transform_state && transform_state->GetTransform());

		bool have_transform = false;
		Matrix4f transform = Matrix4f::Identity();

		if (TransformPtr transform_ptr = computed.transform())
		{
			// First find the current element's transform
			const int n = transform_ptr->GetNumPrimitives();
			for (int i = 0; i < n; ++i)
			{
				const TransformPrimitive& primitive = transform_ptr->GetPrimitive(i);
				Matrix4f matrix = TransformUtilities::ResolveTransform(primitive, *this);
				transform *= matrix;
				have_transform = true;
			}

			if (have_transform)
			{
				// Compute the transform origin
				Vector3f transform_origin(pos.x + size.x * 0.5f, pos.y + size.y * 0.5f, 0);

				if (computed.transform_origin_x().type == Style::TransformOrigin::Percentage)
					transform_origin.x = pos.x + computed.transform_origin_x().value * size.x * 0.01f;
				else
					transform_origin.x = pos.x + computed.transform_origin_x().value;

				if (computed.transform_origin_y().type == Style::TransformOrigin::Percentage)
					transform_origin.y = pos.y + computed.transform_origin_y().value * size.y * 0.01f;
				else
					transform_origin.y = pos.y + computed.transform_origin_y().value;

				transform_origin.z = computed.transform_origin_z();

				// Make the transformation apply relative to the transform origin
				transform = Matrix4f::Translate(transform_origin) * transform * Matrix4f::Translate(-transform_origin);
			}

			// We may want to include the local offsets here, as suggested by the CSS specs, so that the local transform is applied after the offset I
			// believe the motivation is. Then we would need to subtract the absolute zero-offsets during geometry submit whenever we have transforms.
		}

		if (parent && parent->transform_state)
		{
			// Apply the parent's local perspective and transform.
			// @performance: If we have no local transform and no parent perspective, we can effectively just point to the parent transform instead of
			// copying it.
			const TransformState& parent_state = *parent->transform_state;

			if (auto parent_perspective = parent_state.GetLocalPerspective())
			{
				transform = *parent_perspective * transform;
				have_transform = true;
			}

			if (auto parent_transform = parent_state.GetTransform())
			{
				transform = *parent_transform * transform;
				have_transform = true;
			}
		}

		if (have_transform)
		{
			if (!transform_state)
				transform_state = MakeUnique<TransformState>();

			perspective_or_transform_changed |= transform_state->SetTransform(&transform);
		}
		else if (transform_state)
			transform_state->SetTransform(nullptr);

		perspective_or_transform_changed |= (had_transform != have_transform);
	}

	// A change in perspective or transform will require an update to children transforms as well.
	if (perspective_or_transform_changed)
	{
		for (size_t i = 0; i < children.size(); i++)
			children[i]->DirtyTransformState(false, true);
	}

	// No reason to keep the transform state around if transform and perspective have been removed.
	if (transform_state && !transform_state->GetTransform() && !transform_state->GetLocalPerspective())
	{
		transform_state.reset();
	}
}